

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O1

void __thiscall Minisat::StreamBuffer::assureLookahead(StreamBuffer *this)

{
  size_t sVar1;
  
  if (this->size <= this->pos) {
    this->pos = 0;
    sVar1 = fread(this->buf,1,0x100000,(FILE *)this->in);
    this->size = (int)sVar1;
  }
  return;
}

Assistant:

void assureLookahead()
    {
        if (pos >= size) {
            pos = 0;
#ifdef USE_LIBZ
            size = gzread(in, buf, sizeof(buf));
#else
            size = fread(buf, sizeof(unsigned char), sizeof(buf), in);
#endif
        }
    }